

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_value.c
# Opt level: O0

void assert_print_value(char *input)

{
  long lVar1;
  cJSON_bool cVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  char *input_local;
  parse_buffer parsebuffer;
  printbuffer buffer;
  cJSON item [1];
  uchar printed [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&parsebuffer.hooks.reallocate,0,0x40);
  memset(&input_local,0,0x38);
  parsebuffer.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)&item[0].string;
  buffer.buffer = (uchar *)0x400;
  buffer.length = 0;
  buffer.depth._0_4_ = 1;
  buffer._32_8_ = global_hooks.allocate;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  input_local = input;
  sVar3 = strlen(input);
  parsebuffer.content = (uchar *)(sVar3 + 1);
  parsebuffer.depth = (size_t)global_hooks.allocate;
  parsebuffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  parsebuffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  memset(&buffer.hooks.reallocate,0,0x40);
  cVar2 = parse_value((cJSON *)&buffer.hooks.reallocate,(parse_buffer *)&input_local);
  if (cVar2 == 0) {
    UnityFail("Failed to parse value.",0x31);
  }
  cVar2 = print_value((cJSON *)&buffer.hooks.reallocate,(printbuffer *)&parsebuffer.hooks.reallocate
                     );
  if (cVar2 == 0) {
    UnityFail("Failed to print value.",0x33);
  }
  UnityAssertEqualString
            (input,parsebuffer.hooks.reallocate,"Printed value is not as expected.",0x34);
  reset(&buffer.hooks.reallocate);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_print_value(const char *input)
{
    unsigned char printed[1024];
    cJSON item[1];
    printbuffer buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    parse_buffer parsebuffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.buffer = printed;
    buffer.length = sizeof(printed);
    buffer.offset = 0;
    buffer.noalloc = true;
    buffer.hooks = global_hooks;

    parsebuffer.content = (const unsigned char*)input;
    parsebuffer.length = strlen(input) + sizeof("");
    parsebuffer.hooks = global_hooks;

    memset(item, 0, sizeof(item));

    TEST_ASSERT_TRUE_MESSAGE(parse_value(item, &parsebuffer), "Failed to parse value.");

    TEST_ASSERT_TRUE_MESSAGE(print_value(item, &buffer), "Failed to print value.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(input, buffer.buffer, "Printed value is not as expected.");

    reset(item);
}